

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.cpp
# Opt level: O2

void deqp::gls::StateQueryUtil::queryPointerState
               (ResultCollector *result,CallLogWrapper *gl,QueryType type,GLenum pname,
               QueriedState *state)

{
  bool bVar1;
  StateQueryMemoryWriteGuard<void_*> value;
  StateQueryMemoryWriteGuard<void_*> SStack_38;
  
  if (type == QUERY_POINTER) {
    StateQueryMemoryWriteGuard<void_*>::StateQueryMemoryWriteGuard(&SStack_38);
    glu::CallLogWrapper::glGetPointerv(gl,pname,&SStack_38.m_value);
    bVar1 = checkError(result,gl,"glGetPointerv");
    if ((bVar1) &&
       (bVar1 = StateQueryMemoryWriteGuard<void_*>::verifyValidity(&SStack_38,result), bVar1)) {
      state->m_type = DATATYPE_POINTER;
      (state->m_v).vInt64 = (GLint64)SStack_38.m_value;
    }
  }
  return;
}

Assistant:

void queryPointerState (tcu::ResultCollector& result, glu::CallLogWrapper& gl, QueryType type, glw::GLenum pname, QueriedState& state)
{
	switch (type)
	{
		case QUERY_POINTER:
		{
			StateQueryMemoryWriteGuard<void*> value;
			gl.glGetPointerv(pname, &value);

			if (!checkError(result, gl, "glGetPointerv"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}
		default:
			DE_ASSERT(false);
	}
}